

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Scanner::scanPlainScalar(Scanner *this)

{
  Twine *pTVar1;
  byte bVar2;
  uint AtColumn;
  bool bVar3;
  size_type sVar4;
  Child Position;
  Child CVar5;
  uint uVar6;
  ulong uVar7;
  Child Position_00;
  Child CVar8;
  uint uVar9;
  StringRef Chars;
  uint local_88;
  Child local_80;
  Child local_68;
  Child local_60;
  long local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  undefined8 local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (this->Indent < -1) {
    __assert_fail("Indent >= -1 && \"Indent must be >= -1 !\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/YAMLParser.cpp"
                  ,0x534,"bool llvm::yaml::Scanner::scanPlainScalar()");
  }
  Position_00 = (Child)this->Current;
  AtColumn = this->Column;
  uVar6 = this->Indent + 1;
  bVar3 = false;
  Position = Position_00;
  while( true ) {
    bVar2 = *Position.cString;
    local_80 = Position;
    if (bVar2 == 0x23) break;
    while( true ) {
      CVar8 = (Child)this->End;
      CVar5 = Position;
      if (((CVar8.twine != Position.twine) && (bVar2 < 0x21)) &&
         ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) break;
      if (this->FlowLevel == 0) {
        if (bVar2 == 0x3a) goto LAB_001ab743;
      }
      else {
        if (bVar2 == 0x3a) {
          bVar2 = *(byte *)((long)&(Position.twine)->LHS + 1);
          if (CVar8.twine == (Twine *)((long)&(Position.twine)->LHS + 1)) {
            if (bVar2 == 0x2c) goto LAB_001ab743;
          }
          else if ((bVar2 < 0x2d) && ((0x100100002600U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
LAB_001ab743:
            pTVar1 = (Twine *)((long)&(Position.twine)->LHS + 1);
            if ((CVar8.twine == pTVar1) ||
               ((uVar7 = (ulong)(byte)(pTVar1->LHS).character, 0x20 < uVar7 ||
                ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0)))) {
              if (this->FlowLevel == 0) goto LAB_001ab791;
              goto LAB_001ab769;
            }
            goto LAB_001ab7ba;
          }
          Twine::Twine((Twine *)&local_68,"Found unexpected \':\' while scanning a plain scalar");
          Position_00 = (Child)this->Current;
          goto LAB_001ab8a8;
        }
LAB_001ab769:
        local_60 = (Child)0x1;
        Chars.Length = 7;
        Chars.Data = ",:?[]{}";
        local_68 = Position;
        sVar4 = StringRef::find_first_of((StringRef *)&local_68,Chars,0);
        CVar5 = (Child)this->Current;
        Position = CVar5;
        if (sVar4 != 0xffffffffffffffff) break;
      }
LAB_001ab791:
      Position.cString = skip_nb_char(this,Position.cString);
      CVar5 = (Child)this->Current;
      if (Position.twine == CVar5.twine) break;
      this->Current = (iterator)Position;
      this->Column = this->Column + 1;
      bVar2 = *Position.cString;
    }
    CVar8 = (Child)this->End;
LAB_001ab7ba:
    local_80 = CVar8;
    if (((CVar8.twine == CVar5.twine) || (local_80 = CVar5, 0x20 < (ulong)(byte)*CVar5.cString)) ||
       ((0x100002600U >> ((ulong)(byte)*CVar5.cString & 0x3f) & 1) == 0)) break;
    uVar9 = this->Column;
    local_88 = this->Line;
    Position = CVar5;
    while (CVar8.twine != Position.twine) {
      bVar2 = *Position.cString;
      if ((0x20 < (ulong)bVar2) || ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) break;
      CVar5.cString = skip_s_white(this,Position.cString);
      if (CVar5.twine == Position.twine) {
        Position.cString = skip_b_break(this,Position.cString);
        this->Column = 0;
        local_88 = local_88 + 1;
        this->Line = local_88;
        uVar9 = 0;
        bVar3 = true;
      }
      else {
        if (((bVar3) && (uVar9 < uVar6)) && (bVar2 == 9)) {
          Twine::Twine((Twine *)&local_68,"Found invalid tab character in indentation");
          Position_00 = Position;
          goto LAB_001ab8a8;
        }
        uVar9 = uVar9 + 1;
        this->Column = uVar9;
        Position.cString = CVar5.cString;
      }
    }
    if ((this->FlowLevel == 0) && (uVar9 < uVar6)) break;
    this->Current = (iterator)Position;
  }
  if (Position_00.twine == local_80.twine) {
    Twine::Twine((Twine *)&local_68,"Got empty plain scalar");
LAB_001ab8a8:
    setError(this,(Twine *)&local_68,Position_00.cString);
    bVar3 = false;
  }
  else {
    local_50 = &local_40;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_68.decUI = 0x12;
    local_58 = (long)local_80.twine - (long)Position_00;
    local_60 = Position_00;
    AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
    ::push_back(&this->TokenQueue,(Token *)&local_68);
    saveSimpleKeyCandidate
              (this,(iterator)
                    (this->TokenQueue).List.Sentinel.
                    super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
                    .super_node_base_type.Prev,AtColumn,false);
    this->IsSimpleKeyAllowed = false;
    std::__cxx11::string::_M_dispose();
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool Scanner::scanPlainScalar() {
  StringRef::iterator Start = Current;
  unsigned ColStart = Column;
  unsigned LeadingBlanks = 0;
  assert(Indent >= -1 && "Indent must be >= -1 !");
  unsigned indent = static_cast<unsigned>(Indent + 1);
  while (true) {
    if (*Current == '#')
      break;

    while (!isBlankOrBreak(Current)) {
      if (  FlowLevel && *Current == ':'
          && !(isBlankOrBreak(Current + 1) || *(Current + 1) == ',')) {
        setError("Found unexpected ':' while scanning a plain scalar", Current);
        return false;
      }

      // Check for the end of the plain scalar.
      if (  (*Current == ':' && isBlankOrBreak(Current + 1))
          || (  FlowLevel
          && (StringRef(Current, 1).find_first_of(",:?[]{}")
              != StringRef::npos)))
        break;

      StringRef::iterator i = skip_nb_char(Current);
      if (i == Current)
        break;
      Current = i;
      ++Column;
    }

    // Are we at the end?
    if (!isBlankOrBreak(Current))
      break;

    // Eat blanks.
    StringRef::iterator Tmp = Current;
    while (isBlankOrBreak(Tmp)) {
      StringRef::iterator i = skip_s_white(Tmp);
      if (i != Tmp) {
        if (LeadingBlanks && (Column < indent) && *Tmp == '\t') {
          setError("Found invalid tab character in indentation", Tmp);
          return false;
        }
        Tmp = i;
        ++Column;
      } else {
        i = skip_b_break(Tmp);
        if (!LeadingBlanks)
          LeadingBlanks = 1;
        Tmp = i;
        Column = 0;
        ++Line;
      }
    }

    if (!FlowLevel && Column < indent)
      break;

    Current = Tmp;
  }
  if (Start == Current) {
    setError("Got empty plain scalar", Start);
    return false;
  }
  Token T;
  T.Kind = Token::TK_Scalar;
  T.Range = StringRef(Start, Current - Start);
  TokenQueue.push_back(T);

  // Plain scalars can be simple keys.
  saveSimpleKeyCandidate(--TokenQueue.end(), ColStart, false);

  IsSimpleKeyAllowed = false;

  return true;
}